

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv.cc
# Opt level: O0

CalculatedFloat
absl::anon_unknown_0::CalculateFromParsedHexadecimal<double>(ParsedFloat *parsed_hex)

{
  Nonnull<bool_*> in_R9;
  CalculatedFloat CVar1;
  CalculatedFloat CVar2;
  uint128 value;
  uint128 local_48;
  undefined1 local_35;
  int local_34;
  type_conflict1 tStack_30;
  bool result_exact;
  int shift;
  int mantissa_width;
  int exponent;
  uint64_t mantissa;
  ParsedFloat *parsed_hex_local;
  
  _mantissa_width = parsed_hex->mantissa;
  shift = parsed_hex->exponent;
  mantissa = (uint64_t)parsed_hex;
  tStack_30 = bit_width<unsigned_long>(_mantissa_width);
  local_34 = NormalizedShiftSize<double>(tStack_30,shift);
  shift = shift + local_34;
  uint128::uint128(&local_48,_mantissa_width);
  value.hi_._0_4_ = local_34;
  value.lo_ = local_48.hi_;
  value.hi_._4_4_ = 0;
  _mantissa_width =
       ShiftRightAndRound((anon_unknown_0 *)local_48.lo_,value,1,SUB81(&local_35,0),in_R9);
  CVar1 = CalculatedFloatFromRawValues<double>(_mantissa_width,shift);
  CVar2._12_4_ = 0;
  CVar2.mantissa = SUB128(CVar1._0_12_,0);
  CVar2.exponent = SUB124(CVar1._0_12_,8);
  return CVar2;
}

Assistant:

CalculatedFloat CalculateFromParsedHexadecimal(
    const strings_internal::ParsedFloat& parsed_hex) {
  uint64_t mantissa = parsed_hex.mantissa;
  int exponent = parsed_hex.exponent;
  // This static_cast is only needed when using a std::bit_width()
  // implementation that does not have the fix for LWG 3656 applied.
  int mantissa_width = static_cast<int>(bit_width(mantissa));
  const int shift = NormalizedShiftSize<FloatType>(mantissa_width, exponent);
  bool result_exact;
  exponent += shift;
  mantissa = ShiftRightAndRound(mantissa, shift,
                                /* input exact= */ true, &result_exact);
  // ParseFloat handles rounding in the hexadecimal case, so we don't have to
  // check `result_exact` here.
  return CalculatedFloatFromRawValues<FloatType>(mantissa, exponent);
}